

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uchar *puVar5;
  ImFont *pIVar6;
  ushort *puVar7;
  ushort *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  undefined7 local_168;
  float fStack_161;
  undefined4 local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  char local_128 [48];
  undefined2 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ImFontConfig local_d0;
  float local_48;
  
  uVar2 = *(uint *)((long)compressed_ttf_data + 8);
  uVar11 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  local_48 = size_pixels;
  puVar5 = (uchar *)ImGui::MemAlloc((ulong)uVar11);
  uVar2 = *compressed_ttf_data;
  if (((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
       0x57bc0000) &&
     (uVar2 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar2 >> 0x18 == 0 && (uVar2 & 0xff0000) == 0) && (uVar2 & 0xff00) == 0) &&
     (uVar2 & 0xff) == 0)) {
    uVar2 = *(uint *)((long)compressed_ttf_data + 8);
    puVar8 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e =
         puVar5 + (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    stb__barrier_out_b = puVar5;
    stb__dout = puVar5;
    do {
      bVar1 = (byte)*puVar8;
      uVar9 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar8 + 3) |
                             (ulong)*(byte *)((long)puVar8 + 1) << 0x10 |
                            (ulong)(byte)puVar8[1] << 8),
                           (ushort)(puVar8[2] << 8 | puVar8[2] >> 8) + 1);
                puVar7 = puVar8 + 3;
              }
              else {
                if (uVar9 == 6) {
                  uVar10 = ~((ulong)*(byte *)((long)puVar8 + 3) |
                             (ulong)*(byte *)((long)puVar8 + 1) << 0x10 |
                            (ulong)(byte)puVar8[1] << 8);
                  uVar9 = (uint)(byte)puVar8[2];
                  goto LAB_0020a262;
                }
                puVar7 = puVar8;
                if (uVar9 == 7) {
                  stb__lit((byte *)((long)puVar8 + 3),
                           (ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                   *(ushort *)((long)puVar8 + 1) >> 8) + 1);
                  puVar7 = (ushort *)
                           ((long)puVar8 +
                           (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                          *(ushort *)((long)puVar8 + 1) >> 8) + 4);
                }
              }
            }
            else {
              stb__lit((uchar *)(puVar8 + 1),
                       ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar8 + 1)) - 0x7ff);
              puVar7 = (ushort *)
                       ((long)puVar8 + ((ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8) - 0x7fd));
            }
          }
          else {
            uVar10 = -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                              ((uint)(byte)puVar8[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar9 = (uint)(ushort)(*(ushort *)((long)puVar8 + 3) << 8 |
                                  *(ushort *)((long)puVar8 + 3) >> 8);
LAB_0020a262:
            stb__match(stb__dout + uVar10,uVar9 + 1);
            puVar7 = (ushort *)((long)puVar8 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                              ((uint)(byte)puVar8[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar8 + 3) + 1);
          puVar7 = puVar8 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar8 + 1),uVar9 - 0x7f);
        puVar7 = puVar8 + 1;
      }
      else if (bVar1 < 0x40) {
        stb__lit((byte *)((long)puVar8 + 1),uVar9 - 0x1f);
        puVar7 = (ushort *)((long)puVar8 + ((ulong)(byte)*puVar8 - 0x1e));
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar8 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                   (byte)puVar8[1] + 1);
        puVar7 = (ushort *)((long)puVar8 + 3);
      }
    } while ((puVar7 != puVar8) &&
            (puVar8 = puVar7,
            stb__dout <=
            puVar5 + (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18)));
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_d0.MergeMode = false;
    local_d0._73_3_ = 0;
    local_d0.FontBuilderFlags = 0;
    local_168._0_3_ = 0;
    local_168._3_4_ = 0;
    fStack_161 = 0.0;
    local_148 = 0;
    fStack_144 = 0.0;
    fStack_140 = 0.0;
    fStack_13c = 0.0;
    local_138 = 0.0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '\0';
    local_128[9] = '\0';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    local_128[0x18] = '\0';
    local_128[0x19] = '\0';
    local_128[0x1a] = '\0';
    local_128[0x1b] = '\0';
    local_128[0x1c] = '\0';
    local_128[0x1d] = '\0';
    local_128[0x1e] = '\0';
    local_128[0x1f] = '\0';
    local_128[0x20] = '\0';
    local_128[0x21] = '\0';
    local_128[0x22] = '\0';
    local_128[0x23] = '\0';
    local_128[0x24] = '\0';
    local_128[0x25] = '\0';
    local_128[0x26] = '\0';
    local_128[0x27] = '\0';
    local_128._40_8_ = 0;
    local_f8 = 0;
    local_d0.OversampleH = 3;
    local_d0.OversampleV = 1;
    local_d0.EllipsisChar = 0xffff;
    local_d0.RasterizerMultiply = 1.0;
    local_d0.GlyphMaxAdvanceX = 3.4028235e+38;
  }
  else {
    local_168 = (undefined7)*(undefined8 *)&font_cfg_template->field_0xd;
    fStack_161 = font_cfg_template->SizePixels;
    local_d0.OversampleH = font_cfg_template->OversampleH;
    local_d0.OversampleV = font_cfg_template->OversampleV;
    local_138 = (font_cfg_template->GlyphOffset).y;
    uVar3._0_1_ = font_cfg_template->PixelSnapH;
    uVar3._1_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    uVar3._4_4_ = (font_cfg_template->GlyphExtraSpacing).x;
    uVar4 = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_148 = (undefined4)uVar3;
    fStack_140 = (float)uVar4;
    fStack_13c = (float)((ulong)uVar4 >> 0x20);
    local_e8 = *(undefined8 *)&font_cfg_template->field_0x34;
    uStack_e0 = *(undefined8 *)((long)&font_cfg_template->GlyphRanges + 4);
    local_d0.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_d0.MergeMode = font_cfg_template->MergeMode;
    local_d0._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_d0.FontBuilderFlags = font_cfg_template->FontBuilderFlags;
    local_d0.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_d0.EllipsisChar = font_cfg_template->EllipsisChar;
    local_128._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_128._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
    local_128._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_128._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_128._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_128._40_8_ = *(undefined8 *)&font_cfg_template->field_0x7e;
    local_f8 = *(undefined2 *)((long)&font_cfg_template->DstFont + 6);
    fStack_144 = (float)uVar3._4_4_;
  }
  local_d0.FontDataOwnedByAtlas = true;
  local_d0._13_3_ = (undefined3)local_168;
  local_d0.FontNo = local_168._3_4_;
  local_d0.GlyphExtraSpacing.x = fStack_144;
  local_d0._32_4_ = local_148;
  local_d0.GlyphOffset.x = fStack_13c;
  local_d0.GlyphExtraSpacing.y = fStack_140;
  local_d0.GlyphOffset.y = local_138;
  local_d0._52_4_ = SUB84(local_e8,0);
  local_d0.GlyphRanges._0_4_ = (undefined4)((ulong)local_e8 >> 0x20);
  local_d0.GlyphRanges._4_4_ = (undefined4)uStack_e0;
  local_d0.GlyphMinAdvanceX = (float)((ulong)uStack_e0 >> 0x20);
  local_d0.DstFont._6_2_ = local_f8;
  local_d0.Name[0x20] = local_128[0x20];
  local_d0.Name[0x21] = local_128[0x21];
  local_d0.Name[0x22] = local_128[0x22];
  local_d0.Name[0x23] = local_128[0x23];
  local_d0.Name[0x24] = local_128[0x24];
  local_d0.Name[0x25] = local_128[0x25];
  local_d0.Name[0x26] = local_128[0x26];
  local_d0.Name[0x27] = local_128[0x27];
  local_d0._126_8_ = local_128._40_8_;
  local_d0.Name[0x10] = local_128[0x10];
  local_d0.Name[0x11] = local_128[0x11];
  local_d0.Name[0x12] = local_128[0x12];
  local_d0.Name[0x13] = local_128[0x13];
  local_d0.Name[0x14] = local_128[0x14];
  local_d0.Name[0x15] = local_128[0x15];
  local_d0.Name[0x16] = local_128[0x16];
  local_d0.Name[0x17] = local_128[0x17];
  local_d0.Name[0x18] = local_128[0x18];
  local_d0.Name[0x19] = local_128[0x19];
  local_d0.Name[0x1a] = local_128[0x1a];
  local_d0.Name[0x1b] = local_128[0x1b];
  local_d0.Name[0x1c] = local_128[0x1c];
  local_d0.Name[0x1d] = local_128[0x1d];
  local_d0.Name[0x1e] = local_128[0x1e];
  local_d0.Name[0x1f] = local_128[0x1f];
  local_d0.Name[0] = local_128[0];
  local_d0.Name[1] = local_128[1];
  local_d0.Name[2] = local_128[2];
  local_d0.Name[3] = local_128[3];
  local_d0.Name[4] = local_128[4];
  local_d0.Name[5] = local_128[5];
  local_d0.Name[6] = local_128[6];
  local_d0.Name[7] = local_128[7];
  local_d0.Name[8] = local_128[8];
  local_d0.Name[9] = local_128[9];
  local_d0.Name[10] = local_128[10];
  local_d0.Name[0xb] = local_128[0xb];
  local_d0.Name[0xc] = local_128[0xc];
  local_d0.Name[0xd] = local_128[0xd];
  local_d0.Name[0xe] = local_128[0xe];
  local_d0.Name[0xf] = local_128[0xf];
  local_d0.SizePixels =
       (float)(~-(uint)(0.0 < local_48) & (uint)fStack_161 |
              (uint)local_48 & -(uint)(0.0 < local_48));
  local_d0.GlyphRanges = (ImWchar *)CONCAT44(local_d0.GlyphRanges._4_4_,local_d0.GlyphRanges._0_4_);
  if (glyph_ranges != (ImWchar *)0x0) {
    local_d0.GlyphRanges = glyph_ranges;
  }
  local_d0.FontData = puVar5;
  local_d0.FontDataSize = uVar11;
  pIVar6 = AddFont(this,&local_d0);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}